

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_writer_add_read_buf_callback
                  (mz_zip_archive *pZip,char *pArchive_name,mz_file_read_func read_callback,
                  void *callback_opaque,mz_uint64 max_size,time_t *pFile_time,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags,mz_uint32 ext_attributes,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pmVar1;
  bool bVar2;
  size_t sVar3;
  mz_bool mVar4;
  tdefl_status tVar5;
  mz_uint32 mVar6;
  mz_uint64 *pmVar7;
  size_t sVar8;
  mz_uint8 *pmVar9;
  tdefl_compressor *d;
  size_t sVar10;
  undefined4 extraout_var;
  undefined1 uVar11;
  uint uVar12;
  uint uVar13;
  mz_zip_error mVar14;
  tdefl_flush flush;
  undefined4 uVar15;
  mz_uint64 *pmVar16;
  mz_uint64 mVar17;
  mz_uint64 *pComp_size;
  mz_uint64 *pmVar18;
  int iVar19;
  undefined4 uVar20;
  mz_uint64 mVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  mz_uint64 mVar25;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  uint local_11c;
  mz_uint8 *local_118;
  uint local_10c;
  mz_ulong local_108;
  mz_uint64 comp_size;
  mz_uint64 uncomp_size;
  mz_uint8 *local_f0;
  size_t local_e8;
  ulong local_e0;
  mz_uint64 local_d8;
  int local_cc;
  undefined1 local_c8 [6];
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 uStack_c0;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  undefined1 uStack_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined8 uStack_b2;
  mz_uint64 local_dir_header_ofs;
  uint local_98;
  uint local_94;
  char *local_90;
  mz_zip_writer_add_state state;
  mz_uint8 extra_data [28];
  
  dos_time = 0;
  dos_date = 0;
  local_118 = (mz_uint8 *)pZip->m_archive_size;
  uncomp_size = 0;
  uVar13 = 6;
  if (-1 < (int)level_and_flags) {
    uVar13 = level_and_flags;
  }
  comp_size = 0;
  uVar24 = uVar13 & 0x20000;
  uVar12 = uVar24 >> 0xe ^ 8;
  local_10c = uVar12 + 0x800;
  if ((uVar13 >> 0x10 & 1) != 0) {
    local_10c = uVar12;
  }
  pmVar1 = pZip->m_pState;
  if ((((pmVar1 == (mz_zip_internal_state *)0x0) || (pArchive_name == (char *)0x0)) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
     (local_11c = uVar13 & 0xf, pComment == (void *)0x0 && comment_size != 0 || 10 < local_11c)) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  iVar22 = pmVar1->m_zip64;
  if (max_size >> 0x20 != 0 && iVar22 == 0) {
    pmVar1->m_zip64 = 1;
    iVar22 = 1;
  }
  if ((uVar13 >> 10 & 1) != 0) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (*pArchive_name == '/') {
LAB_0010cb44:
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  if (iVar22 == 0) {
    bVar2 = true;
    if (pZip->m_total_files == 0xffff) {
      pmVar1->m_zip64 = 1;
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
    if (pZip->m_total_files == 0xffffffff) {
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
  }
  local_d8 = max_size;
  local_90 = pArchive_name;
  local_e8 = strlen(pArchive_name);
  if (0xffff < local_e8) goto LAB_0010cb44;
  iVar22 = (int)pZip->m_file_offset_alignment;
  uVar13 = iVar22 - 1;
  uVar23 = (ulong)(iVar22 - (uVar13 & (uint)local_118) & uVar13);
  if (pZip->m_file_offset_alignment == 0) {
    uVar23 = 0;
  }
  sVar8 = (pmVar1->m_central_dir).m_size;
  if (0xfffffffe < local_e8 + comment_size + sVar8 + 0x4a) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  if ((bVar2) &&
     (uVar23 + (ulong)user_extra_data_central_len + (long)local_118 +
               (ulong)user_extra_data_len + (ulong)comment_size + local_e8 * 2 + sVar8 + 0x472 >>
      0x20 != 0)) {
    pmVar1->m_zip64 = 1;
  }
  if (pFile_time != (time_t *)0x0) {
    mz_zip_time_t_to_dos_time(*pFile_time,&dos_time,&dos_date);
  }
  pmVar9 = local_118;
  if (local_d8 < 4) {
    local_11c = 0;
  }
  mVar4 = mz_zip_writer_write_zeros(pZip,(mz_uint64)local_118,(mz_uint32)uVar23);
  sVar3 = local_e8;
  if (mVar4 == 0) goto LAB_0010d444;
  uVar23 = (long)pmVar9 + uVar23;
  local_dir_header_ofs = uVar23;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar23) != 0)) {
    __assert_fail("(cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                  0x2290,
                  "mz_bool mz_zip_writer_add_read_buf_callback(mz_zip_archive *, const char *, mz_file_read_func, void *, mz_uint64, const time_t *, const void *, mz_uint16, mz_uint, mz_uint32, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  iVar22 = (uint)(local_11c != 0) << 3;
  uStack_b8 = 0;
  uStack_b7 = 0;
  uStack_b6 = 0;
  uStack_b5 = 0;
  uStack_b4 = 0;
  uStack_b3 = 0;
  uStack_b2 = 0;
  _local_c8 = 0;
  uStack_c0 = 0;
  uStack_bf = 0;
  uStack_be = 0;
  uStack_bd = 0;
  uStack_bc = 0;
  uStack_bb = 0;
  uStack_ba = 0;
  uStack_b9 = 0;
  if (pmVar1->m_zip64 == 0) {
    if ((comp_size._4_4_ != 0) || (uVar23 >> 0x20 != 0)) goto LAB_0010d45e;
    uVar11 = 0x14;
    if (local_11c == 0) {
      uVar11 = 0;
    }
    local_c8._0_5_ = CONCAT14(uVar11,0x4034b50);
    local_c8 = (undefined1  [6])CONCAT15(0,local_c8._0_5_);
    _local_c8 = CONCAT16((char)local_10c,local_c8);
    _local_c8 = CONCAT17((char)(local_10c >> 8),_local_c8);
    uStack_be = (undefined1)dos_time;
    local_94 = (uint)dos_time;
    uStack_bd = (undefined1)(dos_time >> 8);
    uStack_bc = (undefined1)dos_date;
    local_98 = (uint)dos_date;
    uStack_bb = (undefined1)(dos_date >> 8);
    uStack_ba = 0;
    uStack_b9 = 0;
    uStack_b8 = 0;
    uStack_b7 = 0;
    uStack_b6 = 0;
    uStack_b5 = 0;
    uStack_b4 = 0;
    uStack_b3 = 0;
    uStack_b2 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                                CONCAT12((char)user_extra_data_len,(short)local_e8)) << 0x20;
    uStack_c0 = (char)iVar22;
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar23,local_c8,0x1e);
    if (sVar8 != 0x1e) goto LAB_0010d5ca;
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar23 + 0x1e,local_90,sVar3);
    if (sVar8 != sVar3) goto LAB_0010d5ca;
    mVar25 = uVar23 + 0x1e + sVar3;
    pmVar9 = (mz_uint8 *)0x0;
    local_e0 = 0;
  }
  else {
    if ((local_d8 < 0xffffffff) && (uVar23 < 0xffffffff)) {
      local_f0 = (mz_uint8 *)0x0;
      local_e0 = 0;
    }
    else {
      pmVar7 = (mz_uint64 *)0x0;
      pmVar16 = &local_dir_header_ofs;
      if (uVar24 == 0) {
        if (uVar23 < 0xffffffff) {
          pmVar16 = pmVar7;
        }
        pmVar18 = (mz_uint64 *)0x0;
        pComp_size = (mz_uint64 *)0x0;
      }
      else {
        pmVar18 = &uncomp_size;
        if (local_d8 < 0xffffffff) {
          pmVar18 = pmVar7;
        }
        pComp_size = &comp_size;
        if (local_d8 < 0xffffffff) {
          pComp_size = pmVar7;
        }
        if (uVar23 < 0xffffffff) {
          pmVar16 = pmVar7;
        }
      }
      local_f0 = extra_data;
      mVar6 = mz_zip_writer_create_zip64_extra_data(local_f0,pmVar18,pComp_size,pmVar16);
      local_e0 = (ulong)mVar6;
    }
    sVar3 = local_e8;
    iVar19 = (int)local_e0 + user_extra_data_len;
    uVar11 = 0x14;
    if (local_11c == 0) {
      uVar11 = 0;
    }
    local_c8._0_5_ = CONCAT14(uVar11,0x4034b50);
    local_c8 = (undefined1  [6])CONCAT15(0,local_c8._0_5_);
    _local_c8 = CONCAT16((char)(local_10c & 0xffff),local_c8);
    _local_c8 = CONCAT17((char)((local_10c & 0xffff) >> 8),_local_c8);
    uStack_bf = 0;
    uStack_be = (undefined1)dos_time;
    local_94 = (uint)dos_time;
    uStack_bd = (undefined1)(dos_time >> 8);
    uStack_bc = (undefined1)dos_date;
    local_98 = (uint)dos_date;
    uStack_bb = (undefined1)(dos_date >> 8);
    uStack_ba = 0;
    uStack_b9 = 0;
    uStack_b8 = 0;
    uStack_b7 = 0;
    uStack_b6 = 0;
    uStack_b5 = 0;
    uStack_b4 = 0;
    uStack_b3 = 0;
    uStack_b2 = (ulong)CONCAT13((char)((uint)iVar19 >> 8),CONCAT12((char)iVar19,(short)local_e8)) <<
                0x20;
    uStack_c0 = (char)iVar22;
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar23,local_c8,0x1e);
    if (sVar8 != 0x1e) goto LAB_0010d444;
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar23 + 0x1e,local_90,sVar3);
    if (sVar8 != sVar3) goto LAB_0010d444;
    mVar25 = uVar23 + 0x1e + sVar3;
    uVar23 = local_e0 & 0xffffffff;
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,extra_data,uVar23);
    if (sVar8 != uVar23) goto LAB_0010d444;
    mVar25 = mVar25 + uVar23;
    pmVar9 = local_f0;
  }
  if (user_extra_data_len != 0) {
    uVar23 = (ulong)user_extra_data_len;
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,user_extra_data,uVar23);
    if (sVar8 != uVar23) {
LAB_0010d5ca:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    mVar25 = mVar25 + uVar23;
  }
  local_f0 = pmVar9;
  if (local_d8 == 0) {
    local_108 = 0;
  }
  else {
    pmVar9 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
    if (pmVar9 == (mz_uint8 *)0x0) {
LAB_0010d1a3:
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    local_118 = pmVar9;
    local_cc = iVar22;
    if (local_11c == 0) {
      sVar8 = (*read_callback)(callback_opaque,0,pmVar9,0x10000);
      pmVar9 = local_118;
      if (sVar8 == 0) {
        local_108 = 0;
        mVar21 = 0;
        uVar23 = 0;
      }
      else {
        local_108 = 0;
        mVar21 = 0;
        do {
          if ((0x10000 < sVar8) || (mVar21 = mVar21 + sVar8, local_d8 < mVar21)) {
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
            pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
            return 0;
          }
          sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,pmVar9,sVar8);
          if (sVar10 != sVar8) {
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar9);
            goto LAB_0010d5ca;
          }
          local_108 = mz_crc32(local_108,pmVar9,sVar8);
          mVar25 = mVar25 + sVar8;
          sVar8 = (*read_callback)(callback_opaque,mVar21,pmVar9,0x10000);
          uVar23 = mVar21;
        } while (sVar8 != 0);
      }
    }
    else {
      d = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
      if (d == (tdefl_compressor *)0x0) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar9);
        goto LAB_0010d1a3;
      }
      state.m_comp_size = 0;
      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = mVar25;
      tdefl_init(d,mz_zip_writer_add_put_buf_callback,&state,
                 (uint)(local_11c < 4) << 0xe |
                 tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[local_11c]);
      uVar23 = 0;
      local_108 = 0;
      do {
        sVar8 = (*read_callback)(callback_opaque,uVar23,pmVar9,0x10000);
        mVar14 = MZ_ZIP_FILE_READ_FAILED;
        if ((0x10000 < sVar8) || (uVar23 = uVar23 + sVar8, local_d8 < uVar23)) goto LAB_0010d17b;
        local_108 = mz_crc32(local_108,local_118,sVar8);
        if (pZip->m_pNeeds_keepalive == (mz_file_needs_keepalive)0x0) {
          flush = TDEFL_NO_FLUSH;
        }
        else {
          mVar4 = (*pZip->m_pNeeds_keepalive)(pZip->m_pIO_opaque);
          flush = (uint)(mVar4 != 0) * 3;
        }
        pmVar9 = local_118;
        if (sVar8 == 0) {
          sVar8 = 0;
          flush = TDEFL_FINISH;
        }
        tVar5 = tdefl_compress_buffer(d,local_118,sVar8,flush);
      } while (tVar5 == TDEFL_STATUS_OKAY);
      mVar14 = MZ_ZIP_COMPRESSION_FAILED;
      if (tVar5 != TDEFL_STATUS_DONE) {
LAB_0010d17b:
        pZip->m_last_error = mVar14;
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,d);
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
        return 0;
      }
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,d);
      comp_size = state.m_comp_size;
      mVar25 = state.m_cur_archive_file_ofs;
      mVar21 = comp_size;
    }
    uncomp_size = uVar23;
    comp_size = mVar21;
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
    iVar22 = local_cc;
  }
  mVar21 = state.m_cur_archive_file_ofs;
  local_118 = (mz_uint8 *)mVar25;
  local_cc = iVar22;
  if (uVar24 == 0) {
    state.m_pZip = (mz_zip_archive *)
                   CONCAT17((char)(local_108 >> 0x18),
                            CONCAT16((char)(local_108 >> 0x10),
                                     CONCAT15((char)(local_108 >> 8),
                                              CONCAT14((char)local_108,0x8074b50))));
    uVar11 = (undefined1)(uncomp_size >> 0x18);
    if (local_f0 == (mz_uint8 *)0x0) {
      if (comp_size >> 0x20 != 0) {
LAB_0010d45e:
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
        return 0;
      }
      pmVar16 = &state.m_cur_archive_file_ofs;
      state.m_cur_archive_file_ofs._7_1_ = SUB81(mVar21,7);
      state.m_cur_archive_file_ofs._0_7_ =
           CONCAT16((char)(uncomp_size >> 0x10),
                    CONCAT15((char)(uncomp_size >> 8),CONCAT14((char)uncomp_size,(int)comp_size)));
      sVar8 = 0x10;
    }
    else {
      pmVar16 = &state.m_comp_size;
      state.m_cur_archive_file_ofs = comp_size;
      state.m_comp_size._0_7_ = (undefined7)uncomp_size;
      uVar11 = (undefined1)(uncomp_size >> 0x38);
      sVar8 = 0x18;
    }
    *(undefined1 *)((long)pmVar16 + 7) = uVar11;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,&state,sVar8);
    if (sVar10 != sVar8) {
      return 0;
    }
    local_118 = (mz_uint8 *)((long)local_118 + sVar8);
    if (local_f0 == (mz_uint8 *)0x0) goto LAB_0010d51a;
  }
  else {
    if (local_f0 != (mz_uint8 *)0x0) {
      pmVar16 = (mz_uint64 *)0x0;
      pmVar7 = &uncomp_size;
      if (local_d8 < 0xffffffff) {
        pmVar7 = pmVar16;
      }
      pmVar18 = &comp_size;
      if (local_d8 < 0xffffffff) {
        pmVar18 = pmVar16;
      }
      if (0xfffffffe < local_dir_header_ofs) {
        pmVar16 = &local_dir_header_ofs;
      }
      mVar6 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar7,pmVar18,pmVar16);
      local_e0 = (ulong)mVar6;
    }
    mVar25 = local_dir_header_ofs;
    iVar19 = user_extra_data_len + (int)local_e0;
    mVar21 = uncomp_size;
    if (0xfffffffe < uncomp_size) {
      mVar21 = 0xffffffff;
    }
    mVar17 = 0xffffffff;
    if (comp_size < 0xffffffff) {
      mVar17 = comp_size;
    }
    uVar11 = 0x14;
    if (local_11c == 0) {
      uVar11 = 0;
    }
    local_c8._0_5_ = CONCAT14(uVar11,0x4034b50);
    local_c8 = (undefined1  [6])CONCAT15(0,local_c8._0_5_);
    _local_c8 = CONCAT16((char)local_10c,local_c8);
    _local_c8 = CONCAT17((char)(local_10c >> 8),_local_c8);
    uStack_c0 = (undefined1)iVar22;
    uStack_bf = 0;
    uStack_be = (undefined1)local_94;
    uStack_bd = (undefined1)(local_94 >> 8);
    uStack_bc = (undefined1)local_98;
    uStack_bb = (undefined1)(local_98 >> 8);
    uStack_b8 = (undefined1)(local_108 >> 0x10);
    uStack_ba = (undefined1)local_108;
    uStack_b9 = (undefined1)(local_108 >> 8);
    uVar15 = (int)mVar17;
    if (0xfffffffe < local_d8) {
      uVar15 = 0xffffffff;
    }
    uStack_b7 = (undefined1)(local_108 >> 0x18);
    uVar20 = (int)mVar21;
    if (0xfffffffe < local_d8) {
      uVar20 = 0xffffffff;
    }
    uStack_b6 = (undefined1)uVar15;
    uStack_b5 = (undefined1)((uint)uVar15 >> 8);
    uStack_b4 = (undefined1)((uint)uVar15 >> 0x10);
    uStack_b3 = (undefined1)((uint)uVar15 >> 0x18);
    uStack_b2 = CONCAT17((char)((uint)iVar19 >> 8),
                         CONCAT16((char)iVar19,
                                  CONCAT15((char)(local_e8 >> 8),CONCAT14((char)local_e8,uVar20))));
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,local_c8,0x1e);
    sVar3 = local_e8;
    if (sVar8 != 0x1e) {
LAB_0010d444:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    if (local_f0 == (mz_uint8 *)0x0) goto LAB_0010d51a;
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25 + 0x1e,local_90,local_e8);
    if ((sVar8 != sVar3) ||
       (uVar23 = local_e0 & 0xffffffff,
       sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25 + 0x1e + local_e8,extra_data,uVar23),
       sVar8 != uVar23)) goto LAB_0010d444;
  }
  pmVar16 = (mz_uint64 *)0x0;
  pmVar7 = &uncomp_size;
  if (uncomp_size < 0xffffffff) {
    pmVar7 = pmVar16;
  }
  pmVar18 = &comp_size;
  if (uncomp_size < 0xffffffff) {
    pmVar18 = pmVar16;
  }
  if (0xfffffffe < local_dir_header_ofs) {
    pmVar16 = &local_dir_header_ofs;
  }
  mVar6 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar7,pmVar18,pmVar16);
  local_e0 = CONCAT44(extraout_var,mVar6);
LAB_0010d51a:
  mVar4 = mz_zip_writer_add_to_central_dir
                    (pZip,local_90,(mz_uint16)local_e8,local_f0,(mz_uint16)local_e0,pComment,
                     comment_size,uncomp_size,comp_size,(mz_uint32)local_108,(mz_uint16)local_cc,
                     (mz_uint16)local_10c,dos_time,dos_date,local_dir_header_ofs,ext_attributes,
                     user_extra_data_central,user_extra_data_central_len);
  if (mVar4 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = (mz_uint64)local_118;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_read_buf_callback(
    mz_zip_archive *pZip, const char *pArchive_name,
    mz_file_read_func read_callback, void *callback_opaque, mz_uint64 max_size,
    const MZ_TIME_T *pFile_time, const void *pComment, mz_uint16 comment_size,
    mz_uint level_and_flags, mz_uint32 ext_attributes,
    const char *user_extra_data, mz_uint user_extra_data_len,
    const char *user_extra_data_central, mz_uint user_extra_data_central_len) {
  mz_uint16 gen_flags;
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint64 local_dir_header_ofs, cur_archive_file_ofs = pZip->m_archive_size,
                                  uncomp_size = 0, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  mz_uint8 *pExtra_data = NULL;
  mz_uint32 extra_size = 0;
  mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
  mz_zip_internal_state *pState;
  mz_uint64 file_ofs = 0, cur_archive_header_file_ofs;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  gen_flags = (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)
                  ? 0
                  : MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

  if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
    gen_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

  /* Sanity checks */
  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) ||
      ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  pState = pZip->m_pState;

  if ((!pState->m_zip64) && (max_size > MZ_UINT32_MAX)) {
    /* Source file is too large for non-zip64 */
    /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
    pState->m_zip64 = MZ_TRUE;
  }

  /* We could support this, but why? */
  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

  if (pState->m_zip64) {
    if (pZip->m_total_files == MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
  } else {
    if (pZip->m_total_files == MZ_UINT16_MAX) {
      pState->m_zip64 = MZ_TRUE;
      /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
    }
  }

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > MZ_UINT16_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
  if (((mz_uint64)pState->m_central_dir.m_size +
       MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size +
       MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

  if (!pState->m_zip64) {
    /* Bail early if the archive would obviously become too large */
    if ((pZip->m_archive_size + num_alignment_padding_bytes +
         MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size +
         MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size +
         user_extra_data_len + pState->m_central_dir.m_size +
         MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 1024 +
         MZ_ZIP_DATA_DESCRIPTER_SIZE32 + user_extra_data_central_len) >
        0xFFFFFFFF) {
      pState->m_zip64 = MZ_TRUE;
      /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
    }
  }

#ifndef MINIZ_NO_TIME
  if (pFile_time) {
    mz_zip_time_t_to_dos_time(*pFile_time, &dos_time, &dos_date);
  }
#else
  (void)pFile_time;
#endif

  if (max_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes)) {
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
  }

  cur_archive_file_ofs += num_alignment_padding_bytes;
  local_dir_header_ofs = cur_archive_file_ofs;

  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }

  if (max_size && level) {
    method = MZ_DEFLATED;
  }

  MZ_CLEAR_ARR(local_dir_header);
  if (pState->m_zip64) {
    if (max_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX) {
      pExtra_data = extra_data;
      if (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)
        extra_size = mz_zip_writer_create_zip64_extra_data(
            extra_data, (max_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
            (max_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
            (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                    : NULL);
      else
        extra_size = mz_zip_writer_create_zip64_extra_data(
            extra_data, NULL, NULL,
            (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                    : NULL);
    }

    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)(extra_size + user_extra_data_len), 0, 0, 0, method,
            gen_flags, dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += sizeof(local_dir_header);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                       archive_name_size) != archive_name_size) {
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += archive_name_size;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data,
                       extra_size) != extra_size)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += extra_size;
  } else {
    if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
      return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)user_extra_data_len, 0, 0, 0, method, gen_flags,
            dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += sizeof(local_dir_header);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                       archive_name_size) != archive_name_size) {
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += archive_name_size;
  }

  if (user_extra_data_len > 0) {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       user_extra_data,
                       user_extra_data_len) != user_extra_data_len)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += user_extra_data_len;
  }

  if (max_size) {
    void *pRead_buf =
        pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!level) {
      while (1) {
        size_t n = read_callback(callback_opaque, file_ofs, pRead_buf,
                                 MZ_ZIP_MAX_IO_BUF_SIZE);
        if (n == 0)
          break;

        if ((n > MZ_ZIP_MAX_IO_BUF_SIZE) || (file_ofs + n > max_size)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf,
                           n) != n) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        file_ofs += n;
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
        cur_archive_file_ofs += n;
      }
      uncomp_size = file_ofs;
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(
          pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                     tdefl_create_comp_flags_from_zip_params(
                         level, -15, MZ_DEFAULT_STRATEGY)) !=
          TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
      }

      for (;;) {
        tdefl_status status;
        tdefl_flush flush = TDEFL_NO_FLUSH;

        size_t n = read_callback(callback_opaque, file_ofs, pRead_buf,
                                 MZ_ZIP_MAX_IO_BUF_SIZE);
        if ((n > MZ_ZIP_MAX_IO_BUF_SIZE) || (file_ofs + n > max_size)) {
          mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
          break;
        }

        file_ofs += n;
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);

        if (pZip->m_pNeeds_keepalive != NULL &&
            pZip->m_pNeeds_keepalive(pZip->m_pIO_opaque))
          flush = TDEFL_FULL_FLUSH;

        if (n == 0)
          flush = TDEFL_FINISH;

        status = tdefl_compress_buffer(pComp, pRead_buf, n, flush);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY) {
          mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
          break;
        }
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return MZ_FALSE;
      }

      uncomp_size = file_ofs;
      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  if (!(level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)) {
    mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
    mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

    MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
    MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
    if (pExtra_data == NULL) {
      if (comp_size > MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

      MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
      MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
    } else {
      MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
      MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
      local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
    }

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_footer,
                       local_dir_footer_size) != local_dir_footer_size)
      return MZ_FALSE;

    cur_archive_file_ofs += local_dir_footer_size;
  }

  if (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE) {
    if (pExtra_data != NULL) {
      extra_size = mz_zip_writer_create_zip64_extra_data(
          extra_data, (max_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
          (max_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
          (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                  : NULL);
    }

    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)(extra_size + user_extra_data_len),
            (max_size >= MZ_UINT32_MAX) ? MZ_UINT32_MAX : uncomp_size,
            (max_size >= MZ_UINT32_MAX) ? MZ_UINT32_MAX : comp_size,
            uncomp_crc32, method, gen_flags, dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    cur_archive_header_file_ofs = local_dir_header_ofs;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    if (pExtra_data != NULL) {
      cur_archive_header_file_ofs += sizeof(local_dir_header);

      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                         pArchive_name,
                         archive_name_size) != archive_name_size) {
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
      }

      cur_archive_header_file_ofs += archive_name_size;

      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                         extra_data, extra_size) != extra_size)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

      cur_archive_header_file_ofs += extra_size;
    }
  }

  if (pExtra_data != NULL) {
    extra_size = mz_zip_writer_create_zip64_extra_data(
        extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
        (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
        (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
  }

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data,
          (mz_uint16)extra_size, pComment, comment_size, uncomp_size, comp_size,
          uncomp_crc32, method, gen_flags, dos_time, dos_date,
          local_dir_header_ofs, ext_attributes, user_extra_data_central,
          user_extra_data_central_len))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}